

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientMonitor.cpp
# Opt level: O2

void __thiscall ClientMonitor::notifyRead(ClientMonitor *this,TCPSocket *socket)

{
  mapped_type *ppCVar1;
  
  std::mutex::lock(&this->clientListAccess);
  ppCVar1 = std::__detail::
            _Map_base<TCPSocket,_std::pair<const_TCPSocket,_Client_*>,_std::allocator<std::pair<const_TCPSocket,_Client_*>_>,_std::__detail::_Select1st,_std::equal_to<TCPSocket>,_std::hash<TCPSocket>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<TCPSocket,_std::pair<const_TCPSocket,_Client_*>,_std::allocator<std::pair<const_TCPSocket,_Client_*>_>,_std::__detail::_Select1st,_std::equal_to<TCPSocket>,_std::hash<TCPSocket>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->socketToClientMap,socket);
  (**((*ppCVar1)->super_IONotifiable)._vptr_IONotifiable)();
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return;
}

Assistant:

void ClientMonitor::notifyRead(TCPSocket & socket) {
    std::lock_guard<std::mutex> lock(clientListAccess);
    socketToClientMap[socket]->notifyRead();
}